

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylnsymmat.h
# Opt level: O1

void __thiscall
TPZSkylNSymMatrix<double>::CopyFrom(TPZSkylNSymMatrix<double> *this,TPZMatrix<double> *mat)

{
  TPZSkylNSymMatrix<double> *A;
  
  if (mat == (TPZMatrix<double> *)0x0) {
    A = (TPZSkylNSymMatrix<double> *)0x0;
  }
  else {
    A = (TPZSkylNSymMatrix<double> *)__dynamic_cast(mat,&TPZMatrix<double>::typeinfo,&typeinfo,0);
  }
  if (A != (TPZSkylNSymMatrix<double> *)0x0) {
    (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x4e])
              (this);
    Copy(this,A);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "virtual void TPZSkylNSymMatrix<>::CopyFrom(const TPZMatrix<TVar> *) [TVar = double]",
             0x53);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\nERROR: Called with incompatible type\n.",0x27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Aborting...\n",0xc);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzskylnsymmat.h"
             ,0x49);
}

Assistant:

void CopyFrom(const TPZMatrix<TVar> *  mat) override
  {                                                           
    auto *from = dynamic_cast<const TPZSkylNSymMatrix<TVar> *>(mat);                
    if (from) {                                               
      *this = *from;                                          
    }                                                         
    else                                                      
      {                                                       
        PZError<<__PRETTY_FUNCTION__;                         
        PZError<<"\nERROR: Called with incompatible type\n."; 
        PZError<<"Aborting...\n";                             
        DebugStop();                                          
      }                                                       
  }